

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O2

LY_ERR lyplg_type_compare_int(ly_ctx *UNUSED_ctx,lyd_value *val1,lyd_value *val2)

{
  if (val1->realtype != val2->realtype) {
    return LY_ENOT;
  }
  switch(val1->realtype->basetype) {
  case LY_TYPE_INT8:
    if ((val1->field_2).boolean != (val2->field_2).boolean) {
      return LY_ENOT;
    }
    break;
  case LY_TYPE_INT16:
    if ((val1->field_2).int16 != (val2->field_2).int16) {
      return LY_ENOT;
    }
    break;
  case LY_TYPE_INT32:
    if ((val1->field_2).int32 != (val2->field_2).int32) {
      return LY_ENOT;
    }
    break;
  case LY_TYPE_INT64:
    if ((val1->field_2).dec64 != (val2->field_2).dec64) {
      return LY_ENOT;
    }
  }
  return LY_SUCCESS;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_compare_int(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *val1, const struct lyd_value *val2)
{
    if (val1->realtype != val2->realtype) {
        return LY_ENOT;
    }

    switch (val1->realtype->basetype) {
    case LY_TYPE_INT8:
        if (val1->int8 != val2->int8) {
            return LY_ENOT;
        }
        break;
    case LY_TYPE_INT16:
        if (val1->int16 != val2->int16) {
            return LY_ENOT;
        }
        break;
    case LY_TYPE_INT32:
        if (val1->int32 != val2->int32) {
            return LY_ENOT;
        }
        break;
    case LY_TYPE_INT64:
        if (val1->int64 != val2->int64) {
            return LY_ENOT;
        }
        break;
    default:
        break;
    }
    return LY_SUCCESS;
}